

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O2

Gia_Man_t * Gia_ManStgKHot(Vec_Int_t *vLines,int nIns,int nOuts,int nStates,int kHot,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Vec_t *vCodes;
  Gia_Man_t *p;
  Vec_Int_t *pVVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar7;
  Vec_Vec_t *p_01;
  Vec_Vec_t *p_02;
  Gia_Man_t *p_03;
  byte bVar8;
  int iVar9;
  uint nCap;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  int i;
  bool bVar13;
  int nBits;
  
  if ((vLines->nSize & 3) != 0) {
    __assert_fail("Vec_IntSize(vLines) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,0xdd,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
  }
  vCodes = Gia_ManAssignCodes(kHot,nStates,&nBits);
  if (vCodes->nSize != nStates) {
    __assert_fail("Vec_VecSize(vCodes) == nStates",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,0xe1,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
  }
  if (fVerbose != 0) {
    Gia_ManPrintStateEncoding(vCodes,nBits);
  }
  pcVar10 = (char *)0x2710;
  p = Gia_ManStart(10000);
  pcVar10 = Abc_UtilStrsav(pcVar10);
  p->pName = pcVar10;
  iVar9 = 0;
  if (0 < nBits + nIns) {
    iVar9 = nBits + nIns;
  }
  while (bVar13 = iVar9 != 0, iVar9 = iVar9 + -1, bVar13) {
    Gia_ManAppendCi(p);
  }
  Gia_ManHashAlloc(p);
  bVar8 = (byte)nIns & 0x1f;
  nCap = 1 << bVar8;
  pVVar6 = Vec_IntAlloc(nCap);
  uVar3 = 0;
  uVar11 = 0;
  if (0 < nIns) {
    uVar11 = nIns;
  }
  uVar12 = 0;
  if (0 < 1 << bVar8) {
    uVar12 = nCap;
  }
  for (; uVar3 != uVar12; uVar3 = uVar3 + 1) {
    iVar9 = 1;
    uVar1 = 0;
    while (uVar11 != uVar1) {
      iVar2 = Abc_Var2Lit(uVar1 + 1,(uint)((~uVar3 >> (uVar1 & 0x1f) & 1) != 0));
      iVar9 = Gia_ManHashAnd(p,iVar9,iVar2);
      uVar1 = uVar1 + 1;
    }
    Vec_IntPush(pVVar6,iVar9);
  }
  p_00 = Vec_IntAlloc(nStates);
  iVar2 = 0;
  iVar9 = 0;
  if (0 < nStates) {
    iVar9 = nStates;
  }
  for (; iVar2 != iVar9; iVar2 = iVar2 + 1) {
    pVVar7 = Vec_VecEntryInt(vCodes,iVar2);
    iVar5 = 1;
    for (i = 0; i < pVVar7->nSize; i = i + 1) {
      iVar4 = Vec_IntEntry(pVVar7,i);
      if ((iVar4 < 0) || (nBits <= iVar4)) {
        __assert_fail("b >= 0 && b < nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                      ,0xfc,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
      }
      iVar4 = Abc_Var2Lit(iVar4 + nIns + 1,(uint)(iVar4 < kHot));
      iVar5 = Gia_ManHashAnd(p,iVar5,iVar4);
    }
    Vec_IntPush(p_00,iVar5);
  }
  p_01 = Vec_VecStart(nBits);
  p_02 = Vec_VecStart(nOuts);
  bVar8 = (byte)nOuts;
  uVar11 = 0;
  if (nOuts < 1) {
    nOuts = 0;
  }
  while( true ) {
    if (vLines->nSize <= (int)uVar11) {
      Vec_IntFree(pVVar6);
      Vec_IntFree(p_00);
      Vec_VecFree(vCodes);
      iVar2 = 0;
      iVar9 = p_02->nSize;
      if (p_02->nSize < 1) {
        iVar9 = iVar2;
      }
      for (; iVar9 != iVar2; iVar2 = iVar2 + 1) {
        pVVar6 = Vec_VecEntryInt(p_02,iVar2);
        iVar5 = Gia_ManCreateOrGate(p,pVVar6);
        Gia_ManAppendCo(p,iVar5);
      }
      Vec_VecFree(p_02);
      iVar9 = p_01->nSize;
      iVar2 = 0;
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      for (; iVar9 != iVar2; iVar2 = iVar2 + 1) {
        pVVar6 = Vec_VecEntryInt(p_01,iVar2);
        iVar5 = Gia_ManCreateOrGate(p,pVVar6);
        iVar5 = Abc_LitNotCond(iVar5,(uint)(iVar2 < kHot));
        Gia_ManAppendCo(p,iVar5);
      }
      Vec_VecFree(p_01);
      Gia_ManSetRegNum(p,nBits);
      Gia_ManHashStop(p);
      p_03 = Gia_ManCleanup(p);
      Gia_ManStop(p);
      iVar9 = Gia_ManHasDangling(p_03);
      if (iVar9 != 0) {
        __assert_fail("!Gia_ManHasDangling(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                      ,0x12e,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
      }
      return p_03;
    }
    iVar9 = Vec_IntEntry(vLines,uVar11);
    iVar2 = Vec_IntEntry(vLines,uVar11 | 1);
    iVar5 = Vec_IntEntry(vLines,uVar11 | 2);
    uVar3 = Vec_IntEntry(vLines,uVar11 | 3);
    if ((iVar9 < 0) || ((int)nCap <= iVar9)) {
      __assert_fail("iMint >= 0 && iMint < (1<<nIns)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                    ,0x10b,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
    }
    if ((iVar2 < 0) || (nStates <= iVar2)) break;
    if ((iVar5 < 0) || (nStates <= iVar5)) {
      __assert_fail("iNext >= 0 && iNext < nStates",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                    ,0x10d,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
    }
    if (((int)uVar3 < 0) || (1 << (bVar8 & 0x1f) <= (int)uVar3)) {
      __assert_fail("iOut >= 0 && iOut < (1<<nOuts)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                    ,0x10e,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
    }
    uVar11 = uVar11 + 4;
    iVar9 = Vec_IntEntry(pVVar6,iVar9);
    iVar2 = Vec_IntEntry(p_00,iVar2);
    iVar9 = Gia_ManHashAnd(p,iVar9,iVar2);
    pVVar7 = Vec_VecEntryInt(vCodes,iVar5);
    for (iVar2 = 0; iVar2 < pVVar7->nSize; iVar2 = iVar2 + 1) {
      iVar5 = Vec_IntEntry(pVVar7,iVar2);
      Vec_VecPushInt(p_01,iVar5,iVar9);
    }
    for (uVar12 = 0; nOuts != uVar12; uVar12 = uVar12 + 1) {
      if ((uVar3 >> (uVar12 & 0x1f) & 1) != 0) {
        Vec_VecPushInt(p_02,uVar12,iVar9);
      }
    }
  }
  __assert_fail("iCur >= 0 && iCur < nStates",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                ,0x10c,"Gia_Man_t *Gia_ManStgKHot(Vec_Int_t *, int, int, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManStgKHot( Vec_Int_t * vLines, int nIns, int nOuts, int nStates, int kHot, int fVerbose )
{
    Gia_Man_t * p, * pTemp;
    Vec_Int_t * vInMints, * vCurs, * vVec;
    Vec_Vec_t * vLitsNext, * vLitsOuts, * vCodes;
    int i, b, k, nBits, LitC, Lit;
    assert( Vec_IntSize(vLines) % 4 == 0 );

    // produce state encoding
    vCodes = Gia_ManAssignCodes( kHot, nStates, &nBits );
    assert( Vec_VecSize(vCodes) == nStates );
    if ( fVerbose )
        Gia_ManPrintStateEncoding( vCodes, nBits );

    // start manager
    p = Gia_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( "stg" );
    for ( i = 0; i < nIns + nBits; i++ )
        Gia_ManAppendCi(p);

    // create input minterms
    Gia_ManHashAlloc( p );
    vInMints = Vec_IntAlloc( 1 << nIns );
    for ( i = 0; i < (1 << nIns); i++ )
    {
        for ( Lit = 1, b = 0; b < nIns; b++ )
            Lit = Gia_ManHashAnd( p, Lit, Abc_Var2Lit( b+1, !((i >> b) & 1) ) );
        Vec_IntPush( vInMints, Lit );
    } 

    // create current states
    vCurs  = Vec_IntAlloc( nStates );
    Vec_VecForEachLevelInt( vCodes, vVec, i )
    {
        Lit = 1;
        Vec_IntForEachEntry( vVec, b, k )
        {
            assert( b >= 0 && b < nBits );
            Lit = Gia_ManHashAnd( p, Lit, Abc_Var2Lit(1+nIns+b, (b<kHot)) );
        }
        Vec_IntPush( vCurs, Lit );
    }

    // go through the lines
    vLitsNext = Vec_VecStart( nBits );
    vLitsOuts = Vec_VecStart( nOuts );
    for ( i = 0; i < Vec_IntSize(vLines); )
    {
        int iMint = Vec_IntEntry(vLines, i++);
        int iCur  = Vec_IntEntry(vLines, i++);
        int iNext = Vec_IntEntry(vLines, i++);
        int iOut  = Vec_IntEntry(vLines, i++);
        assert( iMint >= 0 && iMint < (1<<nIns)  );
        assert( iCur  >= 0 && iCur  < nStates    );
        assert( iNext >= 0 && iNext < nStates    );
        assert( iOut  >= 0 && iOut  < (1<<nOuts) );
        // create condition
        LitC = Gia_ManHashAnd( p, Vec_IntEntry(vInMints, iMint), Vec_IntEntry(vCurs, iCur) );
        // update next state
//        Vec_VecPushInt( vLitsNext, iNext, LitC );
        vVec = (Vec_Int_t *)Vec_VecEntryInt( vCodes, iNext );
        Vec_IntForEachEntry( vVec, b, k )
            Vec_VecPushInt( vLitsNext, b, LitC );
        // update outputs
        for ( b = 0; b < nOuts; b++ )
            if ( (iOut >> b) & 1 ) 
                Vec_VecPushInt( vLitsOuts, b, LitC );
    }
    Vec_IntFree( vInMints );
    Vec_IntFree( vCurs );
    Vec_VecFree( vCodes );

    // create POs
    Vec_VecForEachLevelInt( vLitsOuts, vVec, b )
        Gia_ManAppendCo( p, Gia_ManCreateOrGate(p, vVec) );
    Vec_VecFree( vLitsOuts );

    // create next states
    Vec_VecForEachLevelInt( vLitsNext, vVec, b )
        Gia_ManAppendCo( p, Abc_LitNotCond( Gia_ManCreateOrGate(p, vVec), (b<kHot) ) );
    Vec_VecFree( vLitsNext );

    Gia_ManSetRegNum( p, nBits );
    Gia_ManHashStop( p );

    p = Gia_ManCleanup( pTemp = p );
    Gia_ManStop( pTemp );
    assert( !Gia_ManHasDangling(p) );
    return p;
}